

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaComponentListFree(xmlSchemaItemListPtr list)

{
  xmlSchemaTypeType xVar1;
  void **ppvVar2;
  xmlSchemaTypePtr type;
  xmlChar *str;
  int local_24;
  int i;
  xmlSchemaTreeItemPtr_conflict *items;
  xmlSchemaTreeItemPtr_conflict item;
  xmlSchemaItemListPtr list_local;
  
  if ((list != (xmlSchemaItemListPtr)0x0) && (list->nbItems != 0)) {
    ppvVar2 = list->items;
    for (local_24 = 0; local_24 < list->nbItems; local_24 = local_24 + 1) {
      type = (xmlSchemaTypePtr)ppvVar2[local_24];
      if (type != (xmlSchemaTypePtr)0x0) {
        xVar1 = type->type;
        if (xVar1 == XML_SCHEMA_TYPE_ANY) {
LAB_002119ff:
          xmlSchemaFreeWildcard((xmlSchemaWildcardPtr)type);
        }
        else if (xVar1 - XML_SCHEMA_TYPE_SIMPLE < 2) {
          xmlSchemaFreeType(type);
        }
        else if (xVar1 - XML_SCHEMA_TYPE_SEQUENCE < 3) {
          xmlSchemaFreeModelGroup((xmlSchemaModelGroupPtr)type);
        }
        else if (xVar1 == XML_SCHEMA_TYPE_ELEMENT) {
          xmlSchemaFreeElement((xmlSchemaElementPtr)type);
        }
        else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTE) {
          xmlSchemaFreeAttribute((xmlSchemaAttributePtr_conflict)type);
        }
        else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
          xmlSchemaFreeAttributeGroup((xmlSchemaAttributeGroupPtr_conflict)type);
        }
        else if (xVar1 == XML_SCHEMA_TYPE_GROUP) {
          xmlSchemaFreeModelGroupDef((xmlSchemaModelGroupDefPtr)type);
        }
        else if (xVar1 == XML_SCHEMA_TYPE_NOTATION) {
          xmlSchemaFreeNotation((xmlSchemaNotationPtr)type);
        }
        else {
          if (xVar1 == XML_SCHEMA_TYPE_ANY_ATTRIBUTE) goto LAB_002119ff;
          if (xVar1 - XML_SCHEMA_TYPE_IDC_UNIQUE < 3) {
            xmlSchemaFreeIDC((xmlSchemaIDCPtr_conflict)type);
          }
          else if (xVar1 == XML_SCHEMA_TYPE_PARTICLE) {
            if (type->next != (_xmlSchemaType *)0x0) {
              xmlSchemaFreeAnnot((xmlSchemaAnnotPtr)type->next);
            }
            (*xmlFree)(type);
          }
          else if (xVar1 == XML_SCHEMA_TYPE_ATTRIBUTE_USE) {
            xmlSchemaFreeAttributeUse((xmlSchemaAttributeUsePtr_conflict)type);
          }
          else if (xVar1 == XML_SCHEMA_EXTRA_QNAMEREF) {
            xmlSchemaFreeQNameRef((xmlSchemaQNameRefPtr)type);
          }
          else if (xVar1 == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) {
            xmlSchemaFreeAttributeUseProhib((xmlSchemaAttributeUseProhibPtr)type);
          }
          else {
            str = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)type);
            xmlSchemaPSimpleInternalErr
                      ((xmlNodePtr)0x0,
                       "Internal error: xmlSchemaComponentListFree, unexpected component type \'%s\'\n"
                       ,str);
          }
        }
      }
    }
    list->nbItems = 0;
  }
  return;
}

Assistant:

static void
xmlSchemaComponentListFree(xmlSchemaItemListPtr list)
{
    if ((list == NULL) || (list->nbItems == 0))
	return;
    {
	xmlSchemaTreeItemPtr item;
	xmlSchemaTreeItemPtr *items = (xmlSchemaTreeItemPtr *) list->items;
	int i;

	for (i = 0; i < list->nbItems; i++) {
	    item = items[i];
	    if (item == NULL)
		continue;
	    switch (item->type) {
		case XML_SCHEMA_TYPE_SIMPLE:
		case XML_SCHEMA_TYPE_COMPLEX:
		    xmlSchemaFreeType((xmlSchemaTypePtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTE:
		    xmlSchemaFreeAttribute((xmlSchemaAttributePtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTE_USE:
		    xmlSchemaFreeAttributeUse((xmlSchemaAttributeUsePtr) item);
		    break;
		case XML_SCHEMA_EXTRA_ATTR_USE_PROHIB:
		    xmlSchemaFreeAttributeUseProhib(
			(xmlSchemaAttributeUseProhibPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ELEMENT:
		    xmlSchemaFreeElement((xmlSchemaElementPtr) item);
		    break;
		case XML_SCHEMA_TYPE_PARTICLE:
		    if (item->annot != NULL)
			xmlSchemaFreeAnnot(item->annot);
		    xmlFree(item);
		    break;
		case XML_SCHEMA_TYPE_SEQUENCE:
		case XML_SCHEMA_TYPE_CHOICE:
		case XML_SCHEMA_TYPE_ALL:
		    xmlSchemaFreeModelGroup((xmlSchemaModelGroupPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		    xmlSchemaFreeAttributeGroup(
			(xmlSchemaAttributeGroupPtr) item);
		    break;
		case XML_SCHEMA_TYPE_GROUP:
		    xmlSchemaFreeModelGroupDef(
			(xmlSchemaModelGroupDefPtr) item);
		    break;
		case XML_SCHEMA_TYPE_ANY:
		case XML_SCHEMA_TYPE_ANY_ATTRIBUTE:
		    xmlSchemaFreeWildcard((xmlSchemaWildcardPtr) item);
		    break;
		case XML_SCHEMA_TYPE_IDC_KEY:
		case XML_SCHEMA_TYPE_IDC_UNIQUE:
		case XML_SCHEMA_TYPE_IDC_KEYREF:
		    xmlSchemaFreeIDC((xmlSchemaIDCPtr) item);
		    break;
		case XML_SCHEMA_TYPE_NOTATION:
		    xmlSchemaFreeNotation((xmlSchemaNotationPtr) item);
		    break;
		case XML_SCHEMA_EXTRA_QNAMEREF:
		    xmlSchemaFreeQNameRef((xmlSchemaQNameRefPtr) item);
		    break;
		default: {
		    /* TODO: This should never be hit. */
		    xmlSchemaPSimpleInternalErr(NULL,
			"Internal error: xmlSchemaComponentListFree, "
			"unexpected component type '%s'\n",
			(const xmlChar *) WXS_ITEM_TYPE_NAME(item));
			 }
		    break;
	    }
	}
	list->nbItems = 0;
    }
}